

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_save.cpp
# Opt level: O0

void save_point_list_proc(ostream *os,Am_Load_Save_Context *context,Am_Value *value)

{
  bool bVar1;
  unsigned_short uVar2;
  void *pvVar3;
  ostream *poVar4;
  float local_44;
  float local_40;
  float y;
  float x;
  undefined1 local_30 [8];
  Am_Point_List list;
  Am_Value *value_local;
  Am_Load_Save_Context *context_local;
  ostream *os_local;
  
  list.item = (Am_Point_Item *)value;
  Am_Load_Save_Context::Save_Type_Name(context,os,"Am_POINT_LIST");
  Am_Point_List::Am_Point_List((Am_Point_List *)local_30,(Am_Value *)list.item);
  uVar2 = Am_Point_List::Length((Am_Point_List *)local_30);
  pvVar3 = (void *)std::ostream::operator<<(os,uVar2);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  Am_Point_List::Start((Am_Point_List *)local_30);
  while( true ) {
    bVar1 = Am_Point_List::Last((Am_Point_List *)local_30);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    Am_Point_List::Get((Am_Point_List *)local_30,&local_40,&local_44);
    poVar4 = (ostream *)std::ostream::operator<<(os,local_40);
    poVar4 = std::operator<<(poVar4," ");
    pvVar3 = (void *)std::ostream::operator<<(poVar4,local_44);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    Am_Point_List::Next((Am_Point_List *)local_30);
  }
  Am_Point_List::~Am_Point_List((Am_Point_List *)local_30);
  return;
}

Assistant:

Am_Define_Method(Am_Save_Method, void, save_point_list,
                 (std::ostream & os, Am_Load_Save_Context &context,
                  const Am_Value &value))
{
  context.Save_Type_Name(os, "Am_POINT_LIST");
  Am_Point_List list = value;
  os << list.Length() << std::endl;
  float x, y;
  for (list.Start(); !list.Last(); list.Next()) {
    list.Get(x, y);
    os << x << " " << y << std::endl;
  }
}